

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O0

void __thiscall BlindFactor_Constractor_Test::TestBody(BlindFactor_Constractor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  Message local_d0;
  ByteData256 local_c8;
  string local_b0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  BlindFactor blind_factor;
  BlindFactor_Constractor_Test *this_local;
  
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&gtest_ar.message_);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_60,(BlindFactor *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_40,"blind_factor.GetHex().c_str()",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",pcVar2,
             "0000000000000000000000000000000000000000000000000000000000000000");
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  cfd::core::BlindFactor::GetData(&local_c8,(BlindFactor *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_b0,&local_c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_90,"blind_factor.GetData().GetHex().c_str()",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"",pcVar2,
             "0000000000000000000000000000000000000000000000000000000000000000");
  std::__cxx11::string::~string((string *)&local_b0);
  cfd::core::ByteData256::~ByteData256(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_e9 = cfd::core::BlindFactor::IsEmpty((BlindFactor *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)local_e8,(AssertionResult *)"blind_factor.IsEmpty()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(BlindFactor, Constractor) {
  BlindFactor blind_factor;

  EXPECT_STREQ(
      blind_factor.GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(
      blind_factor.GetData().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_TRUE(blind_factor.IsEmpty());
}